

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

StringRef * __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLeftSubString
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length)

{
  BufHdr *in_RDX;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  StringRef *in_stack_ffffffffffffffc8;
  
  if (in_RDX < (BufHdr *)in_RSI->m_length) {
    StringRefBase(in_RSI,in_RDX,(C *)in_RSI,(size_t)in_RDI,SUB81((ulong)in_RDI >> 0x38,0));
  }
  else {
    StringRefBase(in_RDI,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

StringRef
	getLeftSubString(size_t length) const {
		if (length >= m_length)
			return *this;

		return StringRef(m_hdr, m_p, length);
	}